

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_compressBlock_opt2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 ZSTD_dictMode_e dictMode)

{
  undefined8 *puVar1;
  ZSTD_OptPrice_e ZVar2;
  ZSTD_optimal_t *pZVar3;
  undefined8 uVar4;
  BYTE *pBVar5;
  BYTE *pBVar6;
  int iVar7;
  U32 UVar8;
  U32 UVar9;
  U32 UVar10;
  optState_t *poVar11;
  ZSTD_match_t *pZVar12;
  undefined4 uVar13;
  U32 UVar14;
  int iVar15;
  U32 UVar16;
  uint uVar17;
  U32 *pUVar18;
  seqDef *psVar19;
  rawSeqStore_t *prVar20;
  ZSTD_optimal_t *pZVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  long lVar27;
  uint uVar28;
  ulong *puVar29;
  U32 UVar30;
  uint uVar31;
  int iVar32;
  uint uVar33;
  uint uVar34;
  int iVar35;
  ZSTD_optimal_t *pZVar36;
  ZSTD_optimal_t *pZVar37;
  ulong uVar38;
  U32 nbMatches;
  U32 UStack_154;
  U32 local_150 [2];
  ZSTD_optimal_t *local_148;
  ulong local_140;
  ZSTD_optimal_t *local_138;
  ulong local_130;
  ZSTD_optimal_t *local_128;
  ZSTD_optimal_t *local_120;
  optState_t *local_118;
  ZSTD_matchState_t *local_110;
  ulong *local_108;
  ZSTD_optimal_t *local_100;
  ZSTD_optimal_t *local_f8;
  ZSTD_match_t *local_f0;
  uint local_e8;
  U32 nextToUpdate3;
  undefined8 local_e0;
  U32 local_d8;
  ulong local_d0;
  ulong local_c8;
  U32 *local_c0;
  U32 local_b8;
  U32 local_b4;
  void *local_b0;
  code *local_a8;
  ZSTD_optimal_t *local_a0;
  seqStore_t *local_98;
  long local_90;
  U32 *local_88;
  ulong local_80;
  ulong local_78;
  U32 *local_70;
  ZSTD_optLdm_t optLdm;
  
  uVar28 = (ms->cParams).minMatch;
  local_138 = (ZSTD_optimal_t *)((ms->window).base + (ms->window).dictLimit);
  local_c0 = (U32 *)CONCAT71(local_c0._1_7_,uVar28 - 3 != 0);
  uVar38 = (ulong)(uVar28 - 3);
  if (uVar28 - 6 < 0xfffffffd) {
    uVar38 = (ulong)(2 < uVar28) * 3;
  }
  local_a8 = (code *)(&PTR_ZSTD_btGetAllMatches_noDict_3_019bfaa0)[(ulong)dictMode * 4 + uVar38];
  uVar28 = (ms->cParams).targetLength;
  local_e8 = 0xfff;
  if (uVar28 < 0xfff) {
    local_e8 = uVar28;
  }
  nextToUpdate3 = ms->nextToUpdate;
  local_f0 = (ms->opt).matchTable;
  pZVar3 = (ms->opt).priceTable;
  local_e0 = 0;
  local_d8 = 0;
  prVar20 = (rawSeqStore_t *)kNullRawSeqStore;
  if (ms->ldmSeqStore != (rawSeqStore_t *)0x0) {
    prVar20 = ms->ldmSeqStore;
  }
  optLdm.seqStore.capacity = prVar20->capacity;
  optLdm.seqStore.seq = prVar20->seq;
  optLdm.seqStore.pos = prVar20->pos;
  optLdm.seqStore.posInSequence = prVar20->posInSequence;
  optLdm.seqStore.size = prVar20->size;
  optLdm.offset = 0;
  local_c8 = 0;
  optLdm.startPosInBlock = 0;
  optLdm.endPosInBlock = 0;
  pZVar37 = (ZSTD_optimal_t *)((long)src + srcSize);
  pZVar36 = (ZSTD_optimal_t *)((long)src + (srcSize - 8));
  local_110 = ms;
  local_108 = (ulong *)rep;
  local_98 = seqStore;
  ZSTD_opt_getNextMatchAndUpdateSeqStore(&optLdm,0,(U32)srcSize);
  local_118 = &ms->opt;
  ZSTD_rescaleFreqs(&ms->opt,(BYTE *)src,srcSize,2);
  pZVar21 = (ZSTD_optimal_t *)((ulong)(local_138 == (ZSTD_optimal_t *)src) + (long)src);
  local_100 = pZVar37;
  if (pZVar21 < pZVar36) {
    local_d0 = (ulong)((byte)local_c0 + 3);
    local_88 = pZVar3->rep;
    local_70 = pZVar37[-2].rep + 2;
    local_90 = (ulong)((byte)local_c0 + 3) * 0x1c;
    local_c0 = &pZVar3[1].litlen;
    puVar29 = local_108;
    local_b0 = src;
    local_a0 = pZVar36;
    do {
      pZVar12 = local_f0;
      pZVar37 = local_100;
      iVar15 = (int)pZVar21;
      UVar30 = iVar15 - (int)src;
      local_f8 = (ZSTD_optimal_t *)src;
      uVar13 = (*local_a8)(local_f0,local_110,&nextToUpdate3,pZVar21,local_100,puVar29,UVar30 == 0,
                           local_d0);
      _nbMatches = CONCAT44(UStack_154,uVar13);
      ZSTD_optLdm_processMatchCandidate
                (&optLdm,pZVar12,&nbMatches,iVar15 - (int)local_b0,(int)pZVar37 - iVar15);
      UVar16 = nbMatches;
      pZVar37 = (ZSTD_optimal_t *)(_nbMatches & 0xffffffff);
      if (pZVar37 == (ZSTD_optimal_t *)0x0) {
        pZVar21 = (ZSTD_optimal_t *)((long)&pZVar21->price + 1);
      }
      else {
        pZVar3->mlen = 0;
        pZVar3->litlen = UVar30;
        local_148 = pZVar21;
        UVar14 = ZSTD_litLengthPrice(UVar30,local_118,2);
        pZVar3->price = UVar14;
        local_88[2] = (U32)puVar29[1];
        *(ulong *)local_88 = *puVar29;
        uVar28 = pZVar12[UVar16 - 1].len;
        if (local_e8 < uVar28) {
          uVar24 = pZVar12[UVar16 - 1].off;
          pZVar37 = (ZSTD_optimal_t *)0x0;
LAB_01279887:
          UVar16 = pZVar3[(ulong)pZVar37 & 0xffffffff].rep[2];
          local_150[0] = UVar16;
          _nbMatches = *(ulong *)pZVar3[(ulong)pZVar37 & 0xffffffff].rep;
          uVar38 = _nbMatches;
          if (uVar24 < 4) {
            uVar25 = (uVar24 - 1) + (uint)(UVar30 == 0);
            if (uVar25 == 3) {
              UVar30 = nbMatches - 1;
LAB_012798e3:
              pUVar18 = &UStack_154;
              if (uVar25 == 1) {
                pUVar18 = local_150;
              }
              UVar16 = *pUVar18;
              goto LAB_012798fa;
            }
            if (uVar25 != 0) {
              UVar30 = (&nbMatches)[uVar25];
              goto LAB_012798e3;
            }
          }
          else {
            UStack_154 = (U32)(_nbMatches >> 0x20);
            UVar30 = uVar24 - 3;
            UVar16 = UStack_154;
LAB_012798fa:
            _nbMatches = CONCAT44(nbMatches,UVar30);
            uVar38 = _nbMatches;
          }
          _nbMatches = uVar38;
          *puVar29 = _nbMatches;
          *(U32 *)(puVar29 + 1) = UVar16;
          uVar38 = (ulong)((int)pZVar37 + 2);
          UVar30 = 0;
        }
        else {
          iVar15 = (int)local_148 - (int)local_f8;
          lVar27 = 0x1c;
          do {
            iVar15 = iVar15 + 1;
            *(undefined4 *)((long)pZVar3->rep + lVar27 + -0x10) = 0x40000000;
            *(undefined4 *)((long)pZVar3->rep + lVar27 + -8) = 0;
            *(int *)((long)pZVar3->rep + lVar27 + -4) = iVar15;
            lVar27 = lVar27 + 0x1c;
          } while (local_90 != lVar27);
          pZVar21 = (ZSTD_optimal_t *)0x0;
          local_128 = pZVar37;
          uVar38 = local_d0;
          do {
            local_138 = (ZSTD_optimal_t *)CONCAT44(local_138._4_4_,local_f0[(long)pZVar21].len);
            local_120 = pZVar21;
            if ((uint)uVar38 <= local_f0[(long)pZVar21].len) {
              uVar28 = local_f0[(long)pZVar21].off;
              local_140 = CONCAT44(local_140._4_4_,uVar28);
              uVar25 = 0x1f;
              if (uVar28 != 0) {
                for (; uVar28 >> uVar25 == 0; uVar25 = uVar25 - 1) {
                }
              }
              local_130 = CONCAT44(local_130._4_4_,(local_110->opt).priceType);
              uVar28 = (uint)uVar38 * 0x100 - 0x200;
              do {
                UVar30 = (U32)uVar38;
                if ((U32)local_130 == 1) {
                  iVar15 = 0x1f;
                  if (UVar30 - 2 != 0) {
                    for (; UVar30 - 2 >> iVar15 == 0; iVar15 = iVar15 + -1) {
                    }
                  }
                  iVar15 = (uVar28 >> ((byte)iVar15 & 0x1f)) + (iVar15 + uVar25) * 0x100 + 0x1000;
                }
                else {
                  uVar31 = UVar30 - 3;
                  uVar24 = (local_110->opt).offCodeFreq[uVar25] + 1;
                  iVar15 = 0x1f;
                  if (uVar24 != 0) {
                    for (; uVar24 >> iVar15 == 0; iVar15 = iVar15 + -1) {
                    }
                  }
                  if (uVar31 < 0x80) {
                    uVar31 = (uint)(byte)(&ZSTD_MLcode(unsigned_int)::ML_Code)[uVar31];
                  }
                  else {
                    uVar17 = 0x1f;
                    if (uVar31 != 0) {
                      for (; uVar31 >> uVar17 == 0; uVar17 = uVar17 - 1) {
                      }
                    }
                    uVar31 = (uVar17 ^ 0xffffffe0) + 0x44;
                  }
                  uVar17 = (local_110->opt).matchLengthFreq[uVar31] + 1;
                  iVar32 = 0x1f;
                  if (uVar17 != 0) {
                    for (; uVar17 >> iVar32 == 0; iVar32 = iVar32 + -1) {
                    }
                  }
                  iVar15 = (((local_110->opt).offCodeSumBasePrice +
                            (local_110->opt).matchLengthSumBasePrice) -
                           ((uVar24 * 0x100 >> ((byte)iVar15 & 0x1f)) +
                           (uVar17 * 0x100 >> ((byte)iVar32 & 0x1f)))) +
                           (((byte)ML_bits[uVar31] + uVar25) - (iVar15 + iVar32)) * 0x100 + 0x33;
                }
                iVar32 = pZVar3->price;
                uVar38 = uVar38 & 0xffffffff;
                pZVar3[uVar38].mlen = UVar30;
                pZVar3[uVar38].off = (U32)local_140;
                pZVar3[uVar38].litlen = 0;
                UVar16 = ZSTD_litLengthPrice(0,local_118,2);
                pZVar3[uVar38].price = UVar16 + iVar15 + iVar32;
                uVar38 = (ulong)(UVar30 + 1);
                uVar28 = uVar28 + 0x100;
              } while (UVar30 + 1 <= (U32)local_138);
            }
            pZVar21 = (ZSTD_optimal_t *)((long)&local_120->price + 1);
          } while (pZVar21 != local_128);
          pZVar3[uVar38 & 0xffffffff].price = 0x40000000;
          uVar28 = (int)uVar38 - 1;
          uVar38 = (ulong)uVar28;
          if (uVar28 == 0) {
            uVar38 = 0;
          }
          else {
            pZVar37 = (ZSTD_optimal_t *)&DAT_00000001;
            do {
              poVar11 = local_118;
              local_120 = (ZSTD_optimal_t *)((long)pZVar37->rep + (long)(local_148->rep + -8));
              uVar25 = (int)pZVar37 - 1;
              uVar28 = pZVar3[uVar25].litlen;
              local_130 = CONCAT44(local_130._4_4_,uVar28 + 1);
              local_138 = pZVar37;
              local_128 = pZVar37;
              local_140._0_4_ = pZVar3[uVar25].price;
              UVar30 = ZSTD_rawLiteralsCost
                                 ((undefined1 *)((long)local_148[-1].rep + 0xb) + (long)pZVar37,
                                  (U32)local_118,(optState_t *)0x2,uVar25 * 9);
              iVar32 = UVar30 + (U32)local_140;
              UVar30 = ZSTD_litLengthPrice((U32)local_130,poVar11,2);
              local_140 = CONCAT44(local_140._4_4_,UVar30);
              local_78 = (ulong)uVar28;
              UVar30 = ZSTD_litLengthPrice(uVar28,poVar11,2);
              poVar11 = local_118;
              pZVar21 = local_138;
              iVar32 = ((U32)local_140 - UVar30) + iVar32;
              pZVar37 = pZVar3 + (long)local_128;
              iVar15 = pZVar3[(long)local_128].price;
              iVar35 = (int)local_138;
              if (iVar15 < iVar32) {
                iVar32 = iVar15;
                UVar14 = pZVar37->litlen;
              }
              else {
                pZVar36 = pZVar3 + uVar25;
                uVar28 = pZVar37->off;
                UVar30 = pZVar37->mlen;
                iVar7 = pZVar36->price;
                UVar8 = pZVar36->off;
                UVar9 = pZVar36->mlen;
                UVar10 = pZVar36->litlen;
                UVar14 = pZVar36->rep[0];
                uVar4 = *(undefined8 *)(pZVar36->rep + 1);
                UVar16 = pZVar37->litlen;
                pZVar37->litlen = pZVar36->litlen;
                pZVar37->rep[0] = UVar14;
                *(undefined8 *)(pZVar37->rep + 1) = uVar4;
                pZVar37->price = iVar7;
                pZVar37->off = UVar8;
                pZVar37->mlen = UVar9;
                pZVar37->litlen = UVar10;
                pZVar37->litlen = (U32)local_130;
                pZVar37->price = iVar32;
                UVar14 = (U32)local_130;
                if (UVar16 == 0) {
                  local_140 = CONCAT44(local_140._4_4_,iVar32);
                  pZVar36 = local_148;
                  local_128 = pZVar37;
                  local_b4 = UVar30;
                  local_80 = (ulong)uVar28;
                  UVar30 = ZSTD_litLengthPrice(1,local_118,2);
                  iVar32 = (int)pZVar36;
                  UVar16 = ZSTD_litLengthPrice(0,poVar11,2);
                  if (((int)UVar30 < (int)UVar16) && (local_120 < local_100)) {
                    local_b8 = ZSTD_rawLiteralsCost
                                         ((BYTE *)local_120,(U32)local_118,(optState_t *)0x2,iVar32)
                    ;
                    poVar11 = local_118;
                    iVar15 = (UVar30 - UVar16) + local_b8 + iVar15;
                    UVar30 = ZSTD_litLengthPrice((int)local_78 + 2,local_118,2);
                    UVar16 = ZSTD_litLengthPrice((U32)local_130,poVar11,2);
                    pZVar37 = local_128;
                    iVar32 = (U32)local_140;
                    UVar14 = (U32)local_130;
                    if (iVar15 < (int)((UVar30 + local_b8 + (U32)local_140) - UVar16)) {
                      uVar28 = iVar35 + 1;
                      if (iVar15 < pZVar3[uVar28].price) {
                        uVar25 = iVar35 - local_b4;
                        UVar30 = pZVar3[uVar25].rep[2];
                        local_150[0] = UVar30;
                        _nbMatches = *(ulong *)pZVar3[uVar25].rep;
                        uVar26 = _nbMatches;
                        uVar24 = (uint)local_80;
                        if (uVar24 < 4) {
                          uVar25 = (uVar24 - 1) + (uint)(pZVar3[uVar25].litlen == 0);
                          if (uVar25 == 3) {
                            UVar16 = nbMatches - 1;
LAB_0127970f:
                            pUVar18 = &UStack_154;
                            if (uVar25 == 1) {
                              pUVar18 = local_150;
                            }
                            UVar30 = *pUVar18;
                            goto LAB_01279729;
                          }
                          if (uVar25 != 0) {
                            UVar16 = (&nbMatches)[uVar25];
                            goto LAB_0127970f;
                          }
                        }
                        else {
                          UStack_154 = (U32)(_nbMatches >> 0x20);
                          UVar16 = uVar24 - 3;
                          UVar30 = UStack_154;
LAB_01279729:
                          _nbMatches = CONCAT44(nbMatches,UVar16);
                          uVar26 = _nbMatches;
                        }
                        _nbMatches = uVar26;
                        pZVar36 = pZVar3 + uVar28;
                        pZVar36->off = uVar24;
                        pZVar36->mlen = local_b4;
                        *(ulong *)pZVar36->rep = _nbMatches;
                        pZVar36->rep[2] = UVar30;
                        pZVar36->litlen = 1;
                        pZVar36->price = iVar15;
                        if (uVar28 < (uint)uVar38) {
                          uVar28 = (uint)uVar38;
                        }
                        uVar38 = (ulong)uVar28;
                      }
                    }
                  }
                  else {
                    pZVar37 = local_128;
                    iVar32 = (U32)local_140;
                    UVar14 = (U32)local_130;
                  }
                }
              }
              pZVar36 = local_120;
              if (UVar14 == 0) {
                uVar25 = iVar35 - pZVar37->mlen;
                uVar28 = pZVar37->off;
                UVar30 = pZVar3[uVar25].rep[2];
                local_150[0] = UVar30;
                _nbMatches = *(ulong *)pZVar3[uVar25].rep;
                uVar26 = _nbMatches;
                if (uVar28 < 4) {
                  uVar28 = (uVar28 - 1) + (uint)(pZVar3[uVar25].litlen == 0);
                  if (uVar28 == 3) {
                    UVar16 = nbMatches - 1;
LAB_012793d1:
                    pUVar18 = &UStack_154;
                    if (uVar28 == 1) {
                      pUVar18 = local_150;
                    }
                    UVar30 = *pUVar18;
                    goto LAB_012793e8;
                  }
                  if (uVar28 != 0) {
                    UVar16 = (&nbMatches)[uVar28];
                    goto LAB_012793d1;
                  }
                }
                else {
                  UStack_154 = (U32)(_nbMatches >> 0x20);
                  UVar16 = uVar28 - 3;
                  UVar30 = UStack_154;
LAB_012793e8:
                  _nbMatches = CONCAT44(nbMatches,UVar16);
                  uVar26 = _nbMatches;
                }
                _nbMatches = uVar26;
                *(ulong *)pZVar37->rep = _nbMatches;
                pZVar37->rep[2] = UVar30;
              }
              if (local_120 <= local_a0) {
                if (iVar35 == (int)uVar38) {
                  uVar38 = (ulong)pZVar21 & 0xffffffff;
                  break;
                }
                local_140 = CONCAT44(local_140._4_4_,iVar32);
                UVar30 = ZSTD_litLengthPrice(0,local_118,2);
                pZVar12 = local_f0;
                pZVar21 = local_100;
                uVar13 = (*local_a8)(local_f0,local_110,&nextToUpdate3,pZVar36,local_100,
                                     pZVar37->rep,UVar14 == 0,local_d0);
                pZVar37 = local_120;
                _nbMatches = CONCAT44(UStack_154,uVar13);
                ZSTD_optLdm_processMatchCandidate
                          (&optLdm,pZVar12,&nbMatches,(int)local_120 - (int)local_b0,
                           (int)pZVar21 - (int)local_120);
                uVar26 = _nbMatches & 0xffffffff;
                iVar35 = (int)local_138;
                if (uVar26 != 0) {
                  uVar28 = pZVar12[nbMatches - 1].len;
                  uVar25 = uVar28 + iVar35;
                  if (((local_e8 < uVar28) || (0xfff < uVar25)) ||
                     (local_100 <= (ZSTD_optimal_t *)((long)pZVar37->rep + ((ulong)uVar28 - 0x10))))
                  {
                    if (uVar28 == 0) goto LAB_01279847;
                    uVar24 = local_f0[nbMatches - 1].off;
                    pZVar37 = local_138;
                    goto LAB_0127986f;
                  }
                  iVar15 = UVar30 + (U32)local_140;
                  uVar23 = 0;
                  local_130 = uVar26;
                  do {
                    uVar28 = (uint)local_d0;
                    if (uVar23 != 0) {
                      uVar28 = local_f0[uVar23 - 1].len + 1;
                    }
                    uVar25 = local_f0[uVar23].len;
                    local_140 = uVar23;
                    if (uVar28 <= uVar25) {
                      uVar24 = local_f0[uVar23].off;
                      uVar31 = 0x1f;
                      if (uVar24 != 0) {
                        for (; uVar24 >> uVar31 == 0; uVar31 = uVar31 - 1) {
                        }
                      }
                      ZVar2 = (local_110->opt).priceType;
                      do {
                        if (ZVar2 == zop_predef) {
                          uVar17 = uVar25 - 2;
                          iVar32 = 0x1f;
                          if (uVar17 != 0) {
                            for (; uVar17 >> iVar32 == 0; iVar32 = iVar32 + -1) {
                            }
                          }
                          iVar32 = (uVar17 * 0x100 >> ((byte)iVar32 & 0x1f)) +
                                   (iVar32 + uVar31) * 0x100 + 0x1000;
                        }
                        else {
                          uVar17 = uVar25 - 3;
                          uVar33 = (local_110->opt).offCodeFreq[uVar31] + 1;
                          iVar32 = 0x1f;
                          if (uVar33 != 0) {
                            for (; uVar33 >> iVar32 == 0; iVar32 = iVar32 + -1) {
                            }
                          }
                          if (uVar17 < 0x80) {
                            uVar17 = (uint)(byte)(&ZSTD_MLcode(unsigned_int)::ML_Code)[uVar17];
                          }
                          else {
                            uVar34 = 0x1f;
                            if (uVar17 != 0) {
                              for (; uVar17 >> uVar34 == 0; uVar34 = uVar34 - 1) {
                              }
                            }
                            uVar17 = (uVar34 ^ 0xffffffe0) + 0x44;
                          }
                          uVar34 = (local_110->opt).matchLengthFreq[uVar17] + 1;
                          iVar7 = 0x1f;
                          if (uVar34 != 0) {
                            for (; uVar34 >> iVar7 == 0; iVar7 = iVar7 + -1) {
                            }
                          }
                          iVar32 = (((local_110->opt).offCodeSumBasePrice +
                                    (local_110->opt).matchLengthSumBasePrice) -
                                   ((uVar33 * 0x100 >> ((byte)iVar32 & 0x1f)) +
                                   (uVar34 * 0x100 >> ((byte)iVar7 & 0x1f)))) +
                                   (((byte)ML_bits[uVar17] + uVar31) - (iVar32 + iVar7)) * 0x100 +
                                   0x33;
                        }
                        iVar32 = iVar32 + iVar15;
                        uVar22 = (ulong)(uVar25 + iVar35);
                        if ((uint)uVar38 < uVar25 + iVar35) {
                          uVar38 = uVar38 & 0xffffffff;
                          pUVar18 = local_c0 + uVar38 * 7;
                          do {
                            uVar38 = uVar38 + 1;
                            ((ZSTD_optimal_t *)(pUVar18 + -3))->price = 0x40000000;
                            *pUVar18 = 1;
                            pUVar18 = pUVar18 + 7;
                          } while (uVar38 < uVar22);
LAB_0127963e:
                          pZVar3[uVar22].mlen = uVar25;
                          pZVar3[uVar22].off = uVar24;
                          pZVar3[uVar22].litlen = 0;
                          pZVar3[uVar22].price = iVar32;
                        }
                        else if (iVar32 < pZVar3[uVar22].price) goto LAB_0127963e;
                        uVar25 = uVar25 - 1;
                      } while (uVar28 <= uVar25);
                    }
                    uVar23 = uVar23 + 1;
                  } while (uVar23 != uVar26);
                  pZVar3[(int)uVar38 + 1].price = 0x40000000;
                }
              }
              pZVar37 = (ZSTD_optimal_t *)(ulong)(iVar35 + 1U);
            } while (iVar35 + 1U <= (uint)uVar38);
          }
          uVar25 = (uint)uVar38;
          uVar38 = uVar38 & 0xffffffff;
          uVar31 = pZVar3[uVar38].price;
          local_c8 = (ulong)uVar31;
          uVar24 = pZVar3[uVar38].off;
          uVar28 = pZVar3[uVar38].mlen;
          UVar30 = pZVar3[uVar38].litlen;
          local_d8 = pZVar3[uVar38].rep[2];
          local_e0 = *(undefined8 *)pZVar3[uVar38].rep;
          if (uVar28 == 0) {
LAB_01279847:
            pZVar21 = (ZSTD_optimal_t *)((long)local_148->rep + ((ulong)uVar25 - 0x10));
            puVar29 = local_108;
            goto LAB_01279a1a;
          }
          if (UVar30 == 0) {
            pZVar37 = (ZSTD_optimal_t *)(ulong)(uVar25 - uVar28);
LAB_0127986f:
            UVar30 = pZVar3[(ulong)pZVar37 & 0xffffffff].litlen;
            puVar29 = local_108;
            goto LAB_01279887;
          }
          uVar26 = *(ulong *)pZVar3[uVar38].rep;
          *(U32 *)(local_108 + 1) = pZVar3[uVar38].rep[2];
          *local_108 = uVar26;
          uVar17 = (uVar25 - uVar28) - UVar30;
          uVar38 = (ulong)(uVar17 + 2);
          pZVar3[uVar38].litlen = UVar30;
          pZVar3[uVar38].mlen = 0;
          uVar25 = uVar17 + 1;
          pZVar3[uVar25].price = uVar31;
          pZVar3[uVar25].off = uVar24;
          pZVar3[uVar25].mlen = uVar28;
          pZVar3[uVar25].litlen = UVar30;
          *(undefined8 *)pZVar3[uVar25].rep = local_e0;
          pZVar3[uVar25].rep[2] = local_d8;
          pZVar37 = (ZSTD_optimal_t *)(ulong)uVar17;
        }
        pZVar3[uVar38].price = (int)local_c8;
        pZVar3[uVar38].off = uVar24;
        pZVar3[uVar38].mlen = uVar28;
        pZVar3[uVar38].litlen = UVar30;
        *(undefined8 *)pZVar3[uVar38].rep = local_e0;
        pZVar3[uVar38].rep[2] = local_d8;
        pZVar21 = (ZSTD_optimal_t *)((ulong)pZVar37 & 0xffffffff);
        uVar4._0_4_ = pZVar3[(long)pZVar21].price;
        uVar4._4_4_ = pZVar3[(long)pZVar21].off;
        UVar30 = pZVar3[(long)pZVar21].mlen;
        UVar16 = pZVar3[(long)pZVar21].litlen;
        pZVar3[uVar38].litlen = UVar16;
        uVar26 = uVar38;
        while (UVar30 != 0) {
          uVar26 = (ulong)((uint)uVar26 - 1);
          pZVar3[uVar26].price = (int)uVar4;
          pZVar3[uVar26].off = (int)((ulong)uVar4 >> 0x20);
          pZVar3[uVar26].mlen = UVar30;
          pZVar3[uVar26].litlen = UVar16;
          uVar4 = *(undefined8 *)pZVar3[(long)pZVar21].rep;
          pZVar3[uVar26].rep[2] = pZVar3[(long)pZVar21].rep[2];
          *(undefined8 *)pZVar3[uVar26].rep = uVar4;
          pZVar21 = (ZSTD_optimal_t *)(ulong)((int)pZVar37 - (UVar30 + UVar16));
          uVar4._0_4_ = pZVar3[(long)pZVar21].price;
          uVar4._4_4_ = pZVar3[(long)pZVar21].off;
          UVar30 = pZVar3[(long)pZVar21].mlen;
          UVar16 = pZVar3[(long)pZVar21].litlen;
          pZVar3[uVar26].litlen = UVar16;
          pZVar37 = pZVar21;
        }
        pZVar37 = local_f8;
        pZVar21 = local_148;
        uVar23 = uVar38;
        if ((uint)uVar26 <= (uint)uVar38) {
          do {
            local_140 = uVar23;
            uVar28 = pZVar3[uVar26].mlen;
            uVar25 = pZVar3[uVar26].litlen;
            pZVar21 = (ZSTD_optimal_t *)(ulong)uVar25;
            if ((ulong)uVar28 == 0) {
              pZVar21 = (ZSTD_optimal_t *)((long)pZVar37->rep + (long)(pZVar21->rep + -8));
            }
            else {
              local_138 = (ZSTD_optimal_t *)CONCAT44(local_138._4_4_,pZVar3[uVar26].off);
              ZSTD_updateStats(local_118,uVar25,(BYTE *)pZVar37,pZVar3[uVar26].off,uVar28);
              pBVar6 = (BYTE *)((long)pZVar37->rep + (long)(pZVar21->rep + -8));
              pBVar5 = local_98->lit;
              local_148 = pZVar21;
              if (local_70 < pBVar6) {
                ZSTD_safecopyLiterals(pBVar5,(BYTE *)pZVar37,pBVar6,(BYTE *)local_70);
LAB_01279ab8:
                local_98->lit = local_98->lit + (long)local_148;
                psVar19 = local_98->sequences;
                UVar30 = (U32)local_138;
                if (0xffff < (uint)local_148) {
                  local_98->longLengthType = ZSTD_llt_literalLength;
                  local_98->longLengthPos =
                       (U32)((ulong)((long)psVar19 - (long)local_98->sequencesStart) >> 3);
                }
              }
              else {
                uVar4 = *(undefined8 *)&pZVar37->mlen;
                *(undefined8 *)pBVar5 = *(undefined8 *)pZVar37;
                *(undefined8 *)(pBVar5 + 8) = uVar4;
                if (0x10 < uVar25) {
                  pBVar6 = local_98->lit;
                  uVar4 = *(undefined8 *)(pZVar37->rep + 2);
                  *(undefined8 *)(pBVar6 + 0x10) = *(undefined8 *)pZVar37->rep;
                  *(undefined8 *)(pBVar6 + 0x18) = uVar4;
                  if ((U32 *)0x10 < &pZVar21[-1].litlen) {
                    lVar27 = 0;
                    do {
                      puVar1 = (undefined8 *)((long)pZVar37[1].rep + lVar27 + -0xc);
                      uVar4 = puVar1[1];
                      pBVar5 = pBVar6 + lVar27 + 0x20;
                      *(undefined8 *)pBVar5 = *puVar1;
                      *(undefined8 *)(pBVar5 + 8) = uVar4;
                      puVar1 = (undefined8 *)((long)pZVar37[1].rep + lVar27 + 4);
                      uVar4 = puVar1[1];
                      *(undefined8 *)(pBVar5 + 0x10) = *puVar1;
                      *(undefined8 *)(pBVar5 + 0x18) = uVar4;
                      lVar27 = lVar27 + 0x20;
                    } while (pBVar5 + 0x20 < pBVar6 + (long)pZVar21);
                    goto LAB_01279ab8;
                  }
                }
                local_98->lit = local_98->lit + (long)pZVar21;
                psVar19 = local_98->sequences;
                UVar30 = (U32)local_138;
              }
              psVar19->litLength = (U16)local_148;
              psVar19->offBase = UVar30;
              uVar38 = (ulong)uVar28 - 3;
              if (0xffff < uVar38) {
                local_98->longLengthType = ZSTD_llt_matchLength;
                local_98->longLengthPos =
                     (U32)((ulong)((long)psVar19 - (long)local_98->sequencesStart) >> 3);
              }
              psVar19->mlBase = (U16)uVar38;
              local_98->sequences = psVar19 + 1;
              pZVar37 = (ZSTD_optimal_t *)
                        ((long)pZVar37->rep + ((ulong)((int)local_148 + uVar28) - 0x10));
              uVar38 = local_140;
              pZVar21 = pZVar37;
            }
            uVar28 = (int)uVar26 + 1;
            uVar26 = (ulong)uVar28;
            uVar23 = local_140;
          } while (uVar28 <= (uint)uVar38);
        }
        local_f8 = pZVar37;
        ZSTD_setBasePrices(local_118,2);
        puVar29 = local_108;
      }
LAB_01279a1a:
      src = local_f8;
    } while (pZVar21 < local_a0);
  }
  return (long)local_100 - (long)src;
}

Assistant:

static size_t ZSTD_compressBlock_opt2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        const void* src, size_t srcSize, const ZSTD_dictMode_e dictMode)
{
    return ZSTD_compressBlock_opt_generic(ms, seqStore, rep, src, srcSize, 2 /* optLevel */, dictMode);
}